

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_reference_finite_element.h
# Opt level: O0

size_type __thiscall
lf::fe::ScalarReferenceFiniteElement<double>::NumRefShapeFunctions
          (ScalarReferenceFiniteElement<double> *this)

{
  uint uVar1;
  dim_t dVar2;
  int iVar3;
  size_type sVar4;
  RefEl local_1d;
  uint local_1c;
  uint local_18;
  sub_idx_t subidx;
  dim_t codim;
  size_type cnt;
  ScalarReferenceFiniteElement<double> *this_local;
  
  subidx = 0;
  local_18 = 0;
  _codim = this;
  while( true ) {
    uVar1 = local_18;
    dVar2 = Dimension(this);
    if (dVar2 < uVar1) break;
    local_1c = 0;
    while( true ) {
      uVar1 = local_1c;
      iVar3 = (*this->_vptr_ScalarReferenceFiniteElement[2])();
      local_1d.type_ = (RefElType)iVar3;
      sVar4 = lf::base::RefEl::NumSubEntities(&local_1d,local_18);
      if (sVar4 <= uVar1) break;
      iVar3 = (*this->_vptr_ScalarReferenceFiniteElement[6])(this,(ulong)local_18,(ulong)local_1c);
      subidx = iVar3 + subidx;
      local_1c = local_1c + 1;
    }
    local_18 = local_18 + 1;
  }
  return subidx;
}

Assistant:

[[nodiscard]] virtual size_type NumRefShapeFunctions() const {
    size_type cnt = 0;
    for (dim_t codim = 0; codim <= Dimension(); ++codim) {
      for (sub_idx_t subidx = 0; subidx < RefEl().NumSubEntities(codim);
           ++subidx) {
        cnt += NumRefShapeFunctions(codim, subidx);
      }
    }
    return cnt;
  }